

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O1

ExperimentalAgc * webrtc::Config::default_value<webrtc::ExperimentalAgc>(void)

{
  int iVar1;
  
  if (default_value<webrtc::ExperimentalAgc>()::def == '\0') {
    iVar1 = __cxa_guard_acquire(&default_value<webrtc::ExperimentalAgc>()::def);
    if (iVar1 != 0) {
      default_value<webrtc::ExperimentalAgc>::def = (ExperimentalAgc *)operator_new(8);
      default_value<webrtc::ExperimentalAgc>::def->enabled = true;
      default_value<webrtc::ExperimentalAgc>::def->startup_min_volume = 0;
      __cxa_guard_release(&default_value<webrtc::ExperimentalAgc>()::def);
    }
  }
  return default_value<webrtc::ExperimentalAgc>::def;
}

Assistant:

static const T& default_value() {
    RTC_DEFINE_STATIC_LOCAL(const T, def, ());
    return def;
  }